

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::anon_unknown_1::renderTestProgress(int current_test,int total_tests,string *next_test)

{
  long *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  ulong *puVar6;
  undefined8 *puVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  string __str_1;
  string result;
  string __str_2;
  string __str;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  long *local_110;
  ulong local_108;
  long local_100;
  long lStack_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar11 = -current_test;
  if (0 < current_test) {
    uVar11 = current_test;
  }
  uVar9 = 1;
  if (9 < uVar11) {
    uVar8 = (ulong)uVar11;
    uVar10 = 4;
    do {
      uVar9 = uVar10;
      uVar3 = (uint)uVar8;
      if (uVar3 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_0019707a;
      }
      if (uVar3 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_0019707a;
      }
      if (uVar3 < 10000) goto LAB_0019707a;
      uVar8 = uVar8 / 10000;
      uVar10 = uVar9 + 4;
    } while (99999 < uVar3);
    uVar9 = uVar9 + 1;
  }
LAB_0019707a:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar9 - (char)(current_test >> 0x1f));
  clara::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50[0] + ((uint)current_test >> 0x1f),uVar9,uVar11);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x4ea249);
  local_70 = &local_60;
  plVar5 = plVar1 + 2;
  if ((long *)*plVar1 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar1[3];
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar6 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar6) {
    local_c0 = *puVar6;
    lStack_b8 = plVar1[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar6;
    local_d0 = (ulong *)*plVar1;
  }
  local_c8 = plVar1[1];
  *plVar1 = (long)puVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  uVar11 = -total_tests;
  if (0 < total_tests) {
    uVar11 = total_tests;
  }
  uVar9 = 1;
  if (9 < uVar11) {
    uVar8 = (ulong)uVar11;
    uVar10 = 4;
    do {
      uVar9 = uVar10;
      uVar3 = (uint)uVar8;
      if (uVar3 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_001971e6;
      }
      if (uVar3 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_001971e6;
      }
      if (uVar3 < 10000) goto LAB_001971e6;
      uVar8 = uVar8 / 10000;
      uVar10 = uVar9 + 4;
    } while (99999 < uVar3);
    uVar9 = uVar9 + 1;
  }
LAB_001971e6:
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,(char)uVar9 - (char)(total_tests >> 0x1f));
  clara::std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)total_tests >> 0x1f) + (long)local_130),uVar9,uVar11);
  uVar8 = 0xf;
  if (local_d0 != &local_c0) {
    uVar8 = local_c0;
  }
  if (uVar8 < (ulong)(local_128 + local_c8)) {
    uVar8 = 0xf;
    if (local_130 != local_120) {
      uVar8 = local_120[0];
    }
    if (uVar8 < (ulong)(local_128 + local_c8)) goto LAB_0019726a;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_0019726a:
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_130);
  }
  local_f0 = &local_e0;
  puVar7 = puVar2 + 2;
  if ((undefined8 *)*puVar2 == puVar7) {
    local_e0 = *puVar7;
    uStack_d8 = puVar2[3];
  }
  else {
    local_e0 = *puVar7;
    local_f0 = (undefined8 *)*puVar2;
  }
  local_e8 = puVar2[1];
  *puVar2 = puVar7;
  puVar2[1] = 0;
  *(undefined1 *)puVar7 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_f0);
  puVar6 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar6) {
    local_a0 = *puVar6;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar6;
    local_b0 = (ulong *)*plVar1;
  }
  local_a8 = plVar1[1];
  *plVar1 = (long)puVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  uVar9 = (uint)(((double)current_test / (double)total_tests) * 100.0);
  uVar11 = -uVar9;
  if (0 < (int)uVar9) {
    uVar11 = uVar9;
  }
  uVar10 = 1;
  if (9 < uVar11) {
    uVar8 = (ulong)uVar11;
    uVar3 = 4;
    do {
      uVar10 = uVar3;
      uVar4 = (uint)uVar8;
      if (uVar4 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_001973be;
      }
      if (uVar4 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_001973be;
      }
      if (uVar4 < 10000) goto LAB_001973be;
      uVar8 = uVar8 / 10000;
      uVar3 = uVar10 + 4;
    } while (99999 < uVar4);
    uVar10 = uVar10 + 1;
  }
LAB_001973be:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar10 - (char)((int)uVar9 >> 0x1f));
  clara::std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar9 >> 0x1f) + (long)local_90),uVar10,uVar11);
  uVar8 = 0xf;
  if (local_b0 != &local_a0) {
    uVar8 = local_a0;
  }
  if (uVar8 < (ulong)(local_88 + local_a8)) {
    uVar8 = 0xf;
    if (local_90 != local_80) {
      uVar8 = local_80[0];
    }
    if (uVar8 < (ulong)(local_88 + local_a8)) goto LAB_0019744b;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_0019744b:
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
  }
  local_170 = &local_160;
  puVar7 = puVar2 + 2;
  if ((undefined8 *)*puVar2 == puVar7) {
    local_160 = *puVar7;
    uStack_158 = puVar2[3];
  }
  else {
    local_160 = *puVar7;
    local_170 = (undefined8 *)*puVar2;
  }
  local_168 = puVar2[1];
  *puVar2 = puVar7;
  puVar2[1] = 0;
  *(undefined1 *)puVar7 = 0;
  puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
  puVar7 = puVar2 + 2;
  if ((undefined8 *)*puVar2 == puVar7) {
    local_140 = *puVar7;
    uStack_138 = puVar2[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar7;
    local_150 = (undefined8 *)*puVar2;
  }
  local_148 = puVar2[1];
  *puVar2 = puVar7;
  puVar2[1] = 0;
  *(undefined1 *)(puVar2 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_150,(ulong)(next_test->_M_dataplus)._M_p);
  plVar5 = plVar1 + 2;
  if ((long *)*plVar1 == plVar5) {
    local_100 = *plVar5;
    lStack_f8 = plVar1[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar5;
    local_110 = (long *)*plVar1;
  }
  local_108 = plVar1[1];
  *plVar1 = (long)plVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_108 < 0x50) {
    local_150 = &local_140;
    std::__cxx11::string::_M_construct((ulong)&local_150,'P' - (char)local_108);
    std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_150);
    puVar2 = local_150;
    if (local_150 == &local_140) goto LAB_0019770f;
  }
  else {
    if (local_108 == 0x50) goto LAB_0019770f;
    std::__cxx11::string::substr((ulong)&local_170,(ulong)&local_110);
    puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
    puVar7 = puVar2 + 2;
    if ((undefined8 *)*puVar2 == puVar7) {
      local_140 = *puVar7;
      uStack_138 = puVar2[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *puVar7;
      local_150 = (undefined8 *)*puVar2;
    }
    local_148 = puVar2[1];
    *puVar2 = puVar7;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_150);
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    puVar2 = local_170;
    if (local_170 == &local_160) goto LAB_0019770f;
  }
  operator_delete(puVar2);
LAB_0019770f:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_110,local_108);
  std::ostream::flush();
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  return;
}

Assistant:

void renderTestProgress(int current_test, int total_tests, std::string next_test) {
            double progress = (double) current_test / (double) total_tests;
            int render_width = 80;
            std::string result = "[" + std::to_string(current_test) + "/" + std::to_string(total_tests) + "] (" + std::to_string(int(progress * 100)) + "%): " + next_test;
            if (result.size() < render_width) {
                result += std::string(render_width - result.size(), ' ');
            } else if (result.size() > render_width) {
                result = result.substr(0, render_width - 3) + "...";
            }
            std::cout << "\r" << result;
            std::cout.flush();
        }